

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  PyObject *pPVar1;
  size_t sVar2;
  _func_void_instance_ptr_void_ptr *p_Var3;
  byte bVar4;
  int iVar5;
  undefined1 *this_00;
  iterator iVar6;
  PyTypeObject *pPVar7;
  mapped_type value;
  internals *piVar8;
  mapped_type *pmVar9;
  mapped_type *pptVar10;
  vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>> *pvVar11;
  ulong uVar12;
  long lVar13;
  object *poVar14;
  type_info *ptVar15;
  long *plVar16;
  error_already_set *this_01;
  size_type *psVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k;
  internals *piVar18;
  type_index tindex;
  allocator<char> local_89;
  undefined1 local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pPVar1 = (rec->scope).m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    iVar5 = PyObject_HasAttrString(pPVar1,rec->name);
    if (iVar5 == 1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,rec->name,&local_89);
      std::operator+(&local_68,"generic_type: cannot initialize type \"",&local_48);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_68);
      local_88._0_8_ = *plVar16;
      psVar17 = (size_type *)(plVar16 + 2);
      if ((size_type *)local_88._0_8_ == psVar17) {
        local_88._16_8_ = *psVar17;
        local_88._24_8_ = plVar16[3];
        local_88._0_8_ = local_88 + 0x10;
      }
      else {
        local_88._16_8_ = *psVar17;
      }
      local_88._8_8_ = plVar16[1];
      *plVar16 = (long)psVar17;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      pybind11_fail((string *)local_88);
    }
  }
  piVar18 = (internals *)rec->type;
  if ((rec->field_0x60 & 0x10) == 0) {
    __k = &local_68;
    local_68._M_dataplus._M_p = (pointer)piVar18;
    this_00 = (undefined1 *)get_internals();
  }
  else {
    local_88._0_8_ = piVar18;
    if (registered_local_types_cpp()::locals == '\0') {
      initialize();
    }
    this_00 = registered_local_types_cpp()::locals;
    __k = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
  }
  iVar6 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this_00,(key_type *)__k);
  if ((iVar6.
       super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (*(long *)((long)iVar6.
                      super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
                      ._M_cur + 0x10) != 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,rec->name,&local_89);
    std::operator+(&local_68,"generic_type: type \"",&local_48);
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_88._0_8_ = *plVar16;
    psVar17 = (size_type *)(plVar16 + 2);
    if ((size_type *)local_88._0_8_ == psVar17) {
      local_88._16_8_ = *psVar17;
      local_88._24_8_ = plVar16[3];
      local_88._0_8_ = local_88 + 0x10;
    }
    else {
      local_88._16_8_ = *psVar17;
    }
    local_88._8_8_ = plVar16[1];
    *plVar16 = (long)psVar17;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    pybind11_fail((string *)local_88);
  }
  pPVar7 = (PyTypeObject *)make_new_python_type(rec);
  (this->super_object).super_handle.m_ptr = (PyObject *)pPVar7;
  value = (mapped_type)operator_new(0x98);
  (value->implicit_conversions).
  super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (value->implicit_conversions).
  super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->implicit_conversions).
  super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (value->implicit_casts).
  super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (value->implicit_casts).
  super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->implicit_casts).
  super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value->direct_conversions =
       (vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_> *)0x0;
  value->get_buffer = (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0;
  value->get_buffer_data = (void *)0x0;
  value->module_local_load = (_func_void_ptr_PyObject_ptr_type_info_ptr *)0x0;
  *(undefined8 *)&value->field_0x90 = 0;
  value->type = pPVar7;
  value->cpptype = rec->type;
  sVar2 = rec->type_align;
  value->type_size = rec->type_size;
  value->type_align = sVar2;
  value->holder_size_in_ptrs = (rec->holder_size - 1 >> 3) + 1;
  p_Var3 = rec->init_instance;
  value->operator_new = rec->operator_new;
  value->init_instance = p_Var3;
  value->dealloc = rec->dealloc;
  value->field_0x90 = (byte)rec->field_0x60 >> 1 & 0xc | 3;
  piVar8 = get_internals();
  local_68._M_dataplus._M_p = (pointer)rec->type;
  pmVar9 = std::__detail::
           _Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&piVar8->direct_conversions,(key_type *)&local_68);
  value->direct_conversions = pmVar9;
  piVar18 = piVar8;
  if ((rec->field_0x60 & 0x10) != 0) {
    if (registered_local_types_cpp()::locals == '\0') {
      initialize((generic_type *)local_88);
      piVar18 = (internals *)local_88._0_8_;
    }
    else {
      piVar18 = (internals *)registered_local_types_cpp()::locals;
    }
  }
  pptVar10 = std::__detail::
             _Map_base<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)piVar18,(key_type *)&local_68);
  *pptVar10 = value;
  local_48._M_dataplus._M_p = (pointer)(this->super_object).super_handle.m_ptr;
  local_88._0_8_ = value;
  pvVar11 = (vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>> *)
            std::__detail::
            _Map_base<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&piVar8->registered_types_py,(key_type *)&local_48);
  std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>::
  _M_assign_aux<pybind11::detail::type_info*const*>(pvVar11,local_88,local_88 + 8);
  uVar12 = PyList_Size((rec->bases).super_object.super_handle.m_ptr);
  if ((uVar12 < 2) && ((rec->field_0x60 & 1) == 0)) {
    lVar13 = PyList_Size((rec->bases).super_object.super_handle.m_ptr);
    if (lVar13 != 1) goto LAB_00111d91;
    local_88._8_8_ = (rec->bases).super_object.super_handle.m_ptr;
    local_88._16_8_ = 0;
    local_88._24_8_ = 0;
    poVar14 = accessor<pybind11::detail::accessor_policies::list_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::list_item> *)local_88);
    ptVar15 = get_type_info((PyTypeObject *)(poVar14->super_handle).m_ptr);
    object::~object((object *)(local_88 + 0x18));
    bVar4 = value->field_0x90 & 0xfd | ptVar15->field_0x90 & 2;
  }
  else {
    mark_parents_nonsimple(this,value->type);
    bVar4 = value->field_0x90 & 0xfd;
  }
  value->field_0x90 = bVar4;
LAB_00111d91:
  if ((rec->field_0x60 & 0x10) != 0) {
    value->module_local_load = type_caster_generic::local_load;
    pPVar1 = (this->super_object).super_handle.m_ptr;
    capsule::capsule((capsule *)local_88,value,(char *)0x0,(_func_void_PyObject_ptr *)0x0);
    iVar5 = PyObject_SetAttrString
                      (pPVar1,"__pybind11_module_local_v4_clang_libstdcpp_cxxabi1002__",
                       local_88._0_8_);
    if (iVar5 != 0) {
      this_01 = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this_01);
      __cxa_throw(this_01,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    object::~object((object *)local_88);
  }
  return;
}

Assistant:

void initialize(const type_record &rec) {
        if (rec.scope && hasattr(rec.scope, rec.name))
            pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec.name) +
                          "\": an object with that name is already defined");

        if (rec.module_local ? get_local_type_info(*rec.type) : get_global_type_info(*rec.type))
            pybind11_fail("generic_type: type \"" + std::string(rec.name) +
                          "\" is already registered!");

        m_ptr = make_new_python_type(rec);

        /* Register supplemental type information in C++ dict */
        auto *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) m_ptr;
        tinfo->cpptype = rec.type;
        tinfo->type_size = rec.type_size;
        tinfo->type_align = rec.type_align;
        tinfo->operator_new = rec.operator_new;
        tinfo->holder_size_in_ptrs = size_in_ptrs(rec.holder_size);
        tinfo->init_instance = rec.init_instance;
        tinfo->dealloc = rec.dealloc;
        tinfo->simple_type = true;
        tinfo->simple_ancestors = true;
        tinfo->default_holder = rec.default_holder;
        tinfo->module_local = rec.module_local;

        auto &internals = get_internals();
        auto tindex = std::type_index(*rec.type);
        tinfo->direct_conversions = &internals.direct_conversions[tindex];
        if (rec.module_local)
            registered_local_types_cpp()[tindex] = tinfo;
        else
            internals.registered_types_cpp[tindex] = tinfo;
        internals.registered_types_py[(PyTypeObject *) m_ptr] = { tinfo };

        if (rec.bases.size() > 1 || rec.multiple_inheritance) {
            mark_parents_nonsimple(tinfo->type);
            tinfo->simple_ancestors = false;
        }
        else if (rec.bases.size() == 1) {
            auto parent_tinfo = get_type_info((PyTypeObject *) rec.bases[0].ptr());
            tinfo->simple_ancestors = parent_tinfo->simple_ancestors;
        }

        if (rec.module_local) {
            // Stash the local typeinfo and loader so that external modules can access it.
            tinfo->module_local_load = &type_caster_generic::local_load;
            setattr(m_ptr, PYBIND11_MODULE_LOCAL_ID, capsule(tinfo));
        }
    }